

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap_F.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::Fapply(MLEBABecLap *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  int iVar1;
  bool bVar2;
  Geometry *pGVar3;
  pointer pFVar4;
  MFItInfo *this_00;
  int in_EDX;
  long *in_RDI;
  Box tbx_1;
  iterator __end6_1;
  iterator __begin6_1;
  range_impl<amrex::Box> *__range6_1;
  Box tbx;
  iterator __end6;
  iterator __begin6;
  range_impl<amrex::Box> *__range6;
  bool treat_phi_as_on_centroid;
  bool phi_on_centroid;
  bool beta_on_centroid;
  Array4<const_double> *phiebfab;
  Array4<const_double> *bebfab;
  Array4<const_double> *ccfab;
  Array4<const_double> *bcfab;
  Array4<const_double> *bafab;
  Array4<const_double> *fczfab;
  Array4<const_double> *fcyfab;
  Array4<const_double> *fcxfab;
  Array4<const_double> *apzfab;
  Array4<const_double> *apyfab;
  Array4<const_double> *apxfab;
  Array4<const_double> *vfracfab;
  Array4<const_amrex::EBCellFlag> *flagfab;
  Array4<const_int> *ccmfab;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType fabtyp;
  Array4<const_double> *bzfab;
  Array4<const_double> *byfab;
  Array4<const_double> *bxfab;
  Array4<const_double> *afab;
  Array4<double> *yfab;
  Array4<const_double> *xfab;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  bool extdir_z;
  bool extdir_y;
  bool extdir_x;
  int domhi_z;
  int domlo_z;
  int domhi_y;
  int domlo_y;
  int domhi_x;
  int domlo_x;
  Box *domain_box;
  Real bscalar;
  Real ascalar;
  Array4<const_double> foo;
  int ncomp;
  bool is_eb_inhomog;
  bool is_eb_dirichlet;
  MultiCutFab *ccent;
  MultiCutFab *bcent;
  MultiCutFab *barea;
  Array<const_MultiCutFab_*,_3> fcent;
  Array<const_MultiCutFab_*,_3> area;
  MultiFab *vfrac;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  GpuArray<double,_3U> dxinvarr;
  iMultiFab *ccmask;
  MultiFab *bzcoef;
  MultiFab *bycoef;
  MultiFab *bxcoef;
  MultiFab *acoef;
  Real dhz;
  Real dhy;
  Real dhx;
  Real dhz_1;
  Real dhy_1;
  Real dhx_1;
  bool phi_on_center;
  bool beta_on_center;
  Real dhz_2;
  Real dhy_2;
  Real dhx_2;
  MFIter *in_stack_ffffffffffffe4a8;
  MultiCutFab *in_stack_ffffffffffffe4b0;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffe4b8;
  MFItInfo *in_stack_ffffffffffffe4c0;
  MFItInfo *in_stack_ffffffffffffe4d0;
  FabArrayBase *in_stack_ffffffffffffe4d8;
  MFIter *in_stack_ffffffffffffe4e0;
  undefined7 in_stack_ffffffffffffe4f8;
  byte in_stack_ffffffffffffe4ff;
  Box *in_stack_ffffffffffffe500;
  undefined4 in_stack_ffffffffffffe508;
  int in_stack_ffffffffffffe50c;
  MultiCutFab *in_stack_ffffffffffffe510;
  bool local_1a9d;
  FabType local_1a9c;
  MultiCutFab *local_1a98;
  MultiCutFab *local_1a90;
  MultiCutFab *local_1a88;
  MultiFab *local_1a80;
  FabArray<amrex::EBCellFlagFab> *local_1a78;
  long local_1a70;
  Box local_1a54;
  Box *in_stack_ffffffffffffe5d0;
  EBCellFlagFab *in_stack_ffffffffffffe5d8;
  iterator local_1a20;
  undefined1 local_1a08 [40];
  undefined1 *local_19e0;
  Box local_19d4;
  iterator local_19b8;
  iterator local_19a0;
  undefined1 local_1988 [40];
  undefined1 *local_1960;
  bool local_1953;
  byte local_1952;
  byte local_1951;
  undefined1 local_1950 [64];
  undefined1 *local_1910;
  undefined1 local_1908 [64];
  undefined1 *local_18c8;
  undefined1 local_18c0 [64];
  undefined1 *local_1880;
  undefined1 local_1878 [64];
  undefined1 *local_1838;
  undefined1 local_1830 [64];
  undefined1 *local_17f0;
  undefined1 local_17e8 [64];
  undefined1 *local_17a8;
  undefined1 local_17a0 [64];
  undefined1 *local_1760;
  undefined1 local_1758 [64];
  undefined1 *local_1718;
  undefined1 local_1710 [64];
  undefined1 *local_16d0;
  undefined1 local_16c8 [64];
  undefined1 *local_1688;
  undefined1 local_1680 [64];
  undefined1 *local_1640;
  undefined1 local_1638 [64];
  undefined1 *local_15f8;
  undefined1 local_15f0 [64];
  undefined1 *local_15b0;
  undefined1 local_15a8 [64];
  undefined1 *local_1568;
  int local_1560;
  int local_155c;
  int local_1558;
  int local_1554;
  undefined8 local_1550;
  int local_1548;
  undefined8 local_153c;
  int local_1534;
  _func_int **local_1530;
  _Atomic_word local_1528;
  _func_int **local_1520;
  _Atomic_word local_1518;
  int local_1510;
  int local_150c;
  int local_1508;
  int local_1504;
  undefined8 local_1500;
  int local_14f8;
  undefined8 local_14ec;
  int local_14e4;
  _func_int **local_14e0;
  _Atomic_word local_14d8;
  _func_int **local_14d0;
  _Atomic_word local_14c8;
  FabType local_14c4;
  long local_14c0 [8];
  long *local_1480;
  long local_1478 [8];
  long *local_1438;
  long local_1430 [8];
  long *local_13f0;
  long local_13e8 [8];
  long *local_13a8;
  undefined1 local_13a0 [136];
  FabArray<amrex::EBCellFlagFab> *local_1318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_130c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_12f0;
  MFIter local_12e8;
  MFItInfo local_1288;
  byte local_1273;
  byte local_1272;
  byte local_1271;
  int local_1270;
  int local_126c;
  int local_1268;
  int local_1264;
  int local_1260;
  int local_125c;
  pointer local_1258;
  double local_1250;
  double local_1248;
  Array4<const_double> local_1240;
  int local_1200;
  byte local_11fa;
  byte local_11f9;
  MultiCutFab *local_11f8;
  MultiCutFab *local_11f0;
  MultiCutFab *local_11e8;
  _Head_base<0UL,_amrex::FabArray<amrex::EBCellFlagFab>_*,_false> local_11e0;
  undefined8 local_11d8;
  undefined8 local_11d0;
  undefined8 local_11c8;
  undefined8 local_11c0;
  undefined8 local_11b8;
  MultiFab *local_11b0;
  FabArray<amrex::EBCellFlagFab> *local_11a8;
  long local_11a0;
  GpuArray<double,_3U> local_1198;
  iMultiFab *local_1180;
  const_reference local_1178;
  const_reference local_1170;
  const_reference local_1168;
  MultiFab *local_1160;
  int local_1148;
  _func_int **local_1138;
  _Atomic_word local_1130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1128;
  int local_111c;
  int iStack_1118;
  _Atomic_word local_1114;
  _func_int **local_1110;
  _Atomic_word local_1108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1100;
  int local_10f4;
  int iStack_10f0;
  _Atomic_word local_10ec;
  undefined8 local_10e8;
  int local_10e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10d8;
  int local_10cc;
  int iStack_10c8;
  int local_10c4;
  undefined8 local_10c0;
  int local_10b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10b0;
  int local_10a4;
  int iStack_10a0;
  int local_109c;
  int local_1098;
  int local_1094;
  int local_1090;
  int local_108c;
  MultiCutFab *local_1088;
  double local_1080;
  double local_1078;
  double local_1070;
  double local_1068;
  double local_1060;
  GpuArray<double,_3U> *local_1058;
  long *local_1050;
  long *local_1048;
  long *local_1040;
  long *local_1038;
  FabArray<amrex::EBCellFlagFab> *local_1030;
  MultiCutFab *local_1028;
  int local_1020;
  int local_101c;
  int local_1018;
  int local_1014;
  int local_1010;
  int local_100c;
  int local_1008;
  int local_1004;
  MultiCutFab *local_1000;
  undefined1 local_ff8 [64];
  undefined1 auStack_fb8 [64];
  double local_f78;
  undefined1 auStack_f70 [64];
  undefined1 auStack_f30 [64];
  double local_ef0;
  undefined1 auStack_ee8 [64];
  double local_ea8;
  undefined1 auStack_ea0 [64];
  double local_e60;
  undefined1 auStack_e58 [64];
  undefined1 auStack_e18 [64];
  undefined1 auStack_dd8 [64];
  undefined1 auStack_d98 [64];
  undefined1 auStack_d58 [64];
  int local_d18;
  int local_d14;
  int local_d10;
  int local_d0c;
  int local_d08;
  int local_d04;
  undefined1 auStack_d00 [64];
  undefined1 auStack_cc0 [64];
  undefined1 auStack_c80 [64];
  undefined1 auStack_c40 [64];
  byte local_c00;
  byte local_bff;
  byte local_bfe;
  byte local_bfd;
  byte local_bfc;
  undefined1 auStack_bf8 [64];
  undefined1 auStack_bb8 [64];
  undefined1 auStack_b78 [64];
  undefined1 auStack_b38 [64];
  double local_af8;
  double local_af0;
  double local_ae8;
  int local_adc;
  double local_ad8;
  double local_ad0;
  GpuArray<double,_3U> *local_ac8;
  byte local_aba;
  byte local_ab9;
  byte *local_ab8;
  byte *local_ab0;
  byte *local_aa8;
  int *local_aa0;
  int *local_a98;
  int *local_a90;
  int *local_a88;
  int *local_a80;
  int *local_a78;
  undefined1 *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  long *local_a08;
  long *local_a00;
  long *local_9f8;
  long *local_9f0;
  FabArray<amrex::EBCellFlagFab> *local_9e8;
  MultiCutFab *local_9e0;
  Box *local_9d8;
  undefined1 local_9d0 [64];
  undefined1 auStack_990 [64];
  double local_950;
  undefined1 auStack_948 [64];
  undefined1 auStack_908 [64];
  double local_8c8;
  undefined1 auStack_8c0 [64];
  double local_880;
  undefined1 auStack_878 [64];
  double local_838;
  undefined1 auStack_830 [64];
  undefined1 auStack_7f0 [64];
  undefined1 auStack_7b0 [64];
  undefined1 auStack_770 [64];
  undefined1 auStack_730 [64];
  undefined1 auStack_6f0 [64];
  undefined1 auStack_6b0 [64];
  byte local_670;
  byte local_66f;
  byte local_66e;
  undefined1 auStack_668 [64];
  undefined1 auStack_628 [64];
  byte local_5e8;
  byte local_5e7;
  undefined1 auStack_5e0 [64];
  undefined1 auStack_5a0 [64];
  undefined1 auStack_560 [64];
  undefined1 auStack_520 [70];
  byte local_4da;
  byte local_4d9;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  byte local_4be;
  byte local_4bd;
  int local_4bc;
  double local_4b8;
  double local_4b0;
  GpuArray<double,_3U> *local_4a8;
  byte local_499;
  undefined1 *local_498;
  byte local_489;
  undefined1 *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  long *local_428;
  long *local_420;
  long *local_418;
  long *local_410;
  FabArray<amrex::EBCellFlagFab> *local_408;
  MultiCutFab *local_400;
  Box *local_3f8;
  undefined4 local_3ec;
  _Atomic_word *local_3e8;
  undefined4 local_3dc;
  _Atomic_word *local_3d8;
  undefined4 local_3cc;
  _Atomic_word *local_3c8;
  undefined4 local_3bc;
  _Atomic_word *local_3b8;
  undefined4 local_3ac;
  _Atomic_word *local_3a8;
  undefined4 local_39c;
  _Atomic_word *local_398;
  undefined4 local_38c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_388;
  undefined4 local_37c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_378;
  undefined4 local_36c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_368;
  undefined4 local_35c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_358;
  undefined4 local_34c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_348;
  undefined4 local_33c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_338;
  undefined4 local_32c;
  GpuArray<double,_3U> *local_328;
  undefined4 local_31c;
  GpuArray<double,_3U> *local_318;
  undefined4 local_30c;
  GpuArray<double,_3U> *local_308;
  undefined4 local_2fc;
  GpuArray<double,_3U> *local_2f8;
  undefined4 local_2ec;
  GpuArray<double,_3U> *local_2e8;
  undefined4 local_2dc;
  GpuArray<double,_3U> *local_2d8;
  undefined4 local_2cc;
  GpuArray<double,_3U> *local_2c8;
  undefined4 local_2bc;
  GpuArray<double,_3U> *local_2b8;
  undefined4 local_2ac;
  GpuArray<double,_3U> *local_2a8;
  undefined4 local_29c;
  GpuArray<double,_3U> *local_298;
  undefined4 local_28c;
  GpuArray<double,_3U> *local_288;
  undefined4 local_27c;
  GpuArray<double,_3U> *local_278;
  undefined4 local_26c;
  GpuArray<double,_3U> *local_268;
  undefined4 local_25c;
  GpuArray<double,_3U> *local_258;
  undefined4 local_24c;
  GpuArray<double,_3U> *local_248;
  undefined4 local_23c;
  GpuArray<double,_3U> *local_238;
  undefined4 local_22c;
  GpuArray<double,_3U> *local_228;
  undefined4 local_21c;
  GpuArray<double,_3U> *local_218;
  int local_20c;
  int local_208;
  int local_204;
  long *local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  FabArray<amrex::EBCellFlagFab> *local_1e8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  FabArray<amrex::EBCellFlagFab> *local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  long *local_1b8;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  FabArray<amrex::EBCellFlagFab> *local_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  FabArray<amrex::EBCellFlagFab> *local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  FabArray<amrex::EBCellFlagFab> *local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  FabArray<amrex::EBCellFlagFab> *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  FabArray<amrex::EBCellFlagFab> *local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  FabArray<amrex::EBCellFlagFab> *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  FabArray<amrex::EBCellFlagFab> *local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  FabArray<amrex::EBCellFlagFab> *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  FabArray<amrex::EBCellFlagFab> *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  FabArray<amrex::EBCellFlagFab> *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  FabArray<amrex::EBCellFlagFab> *local_38;
  
  local_1148 = in_EDX;
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  local_1160 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                         ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                          in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  local_1168 = std::array<amrex::MultiFab,_3UL>::operator[]
                         ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffe4b0,
                          (size_type)in_stack_ffffffffffffe4a8);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  local_1170 = std::array<amrex::MultiFab,_3UL>::operator[]
                         ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffe4b0,
                          (size_type)in_stack_ffffffffffffe4a8);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  local_1178 = std::array<amrex::MultiFab,_3UL>::operator[]
                         ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffe4b0,
                          (size_type)in_stack_ffffffffffffe4a8);
  Vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  local_1180 = Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>::operator[]
                         ((Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_> *)
                          in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  pGVar3 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  CoordSys::InvCellSizeArray(&local_1198,&pGVar3->super_CoordSys);
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  pFVar4 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_ffffffffffffe4b0);
  if (pFVar4 == (pointer)0x0) {
    local_1a70 = 0;
  }
  else {
    local_1a70 = __dynamic_cast(pFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
  }
  local_11a0 = local_1a70;
  if (local_1a70 == 0) {
    local_1a78 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_1a78 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                           ((EBFArrayBoxFactory *)in_stack_ffffffffffffe4b0);
  }
  local_11a8 = local_1a78;
  if (local_11a0 == 0) {
    local_1a80 = (MultiFab *)0x0;
  }
  else {
    local_1a80 = EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe4b0);
  }
  local_11b0 = local_1a80;
  if (local_11a0 == 0) {
    memset(&local_11c8,0,0x18);
    local_11c8 = 0;
    local_11c0 = 0;
    local_11b8 = 0;
  }
  else {
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe4b0);
  }
  if (local_11a0 == 0) {
    memset(&local_11e0,0,0x18);
    local_11e0._M_head_impl = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_11d8 = 0;
    local_11d0 = 0;
  }
  else {
    EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe4b0);
  }
  if (local_11a0 == 0) {
    local_1a88 = (MultiCutFab *)0x0;
  }
  else {
    local_1a88 = EBFArrayBoxFactory::getBndryArea((EBFArrayBoxFactory *)in_stack_ffffffffffffe4b0);
  }
  local_11e8 = local_1a88;
  if (local_11a0 == 0) {
    local_1a90 = (MultiCutFab *)0x0;
  }
  else {
    local_1a90 = EBFArrayBoxFactory::getBndryCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe4b0);
  }
  local_11f0 = local_1a90;
  if (local_11a0 == 0) {
    local_1a98 = (MultiCutFab *)0x0;
  }
  else {
    local_1a98 = EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_ffffffffffffe4b0);
  }
  local_11f8 = local_1a98;
  local_11f9 = isEBDirichlet((MLEBABecLap *)0x1506775);
  local_11fa = (int)in_RDI[0x7a] != 0;
  local_1200 = (**(code **)(*in_RDI + 0x28))();
  Array4<const_double>::Array4(&local_1240);
  local_1248 = (double)in_RDI[0x66];
  local_1250 = (double)in_RDI[0x67];
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  pGVar3 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  local_1258 = (pointer)Geometry::Domain(pGVar3);
  local_125c = Box::smallEnd((Box *)local_1258,0);
  local_1260 = Box::bigEnd((Box *)local_1258,0);
  local_1264 = Box::smallEnd((Box *)local_1258,1);
  local_1268 = Box::bigEnd((Box *)local_1258,1);
  local_126c = Box::smallEnd((Box *)local_1258,2);
  local_1270 = Box::bigEnd((Box *)local_1258,2);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  pGVar3 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  bVar2 = Geometry::isPeriodic(pGVar3,0);
  local_1271 = (bVar2 ^ 0xffU) & 1;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  pGVar3 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  bVar2 = Geometry::isPeriodic(pGVar3,1);
  local_1272 = (bVar2 ^ 0xffU) & 1;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  pGVar3 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
  bVar2 = Geometry::isPeriodic(pGVar3,2);
  local_1273 = (bVar2 ^ 0xffU) & 1;
  MFItInfo::MFItInfo(in_stack_ffffffffffffe4c0);
  this_00 = MFItInfo::EnableTiling(&local_1288,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this_00,true);
  MFIter::MFIter(in_stack_ffffffffffffe4e0,in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  while (bVar2 = MFIter::isValid(&local_12e8), bVar2) {
    MFIter::tilebox((MFIter *)in_stack_ffffffffffffe510);
    local_12f0 = &local_130c;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
               (MFIter *)in_stack_ffffffffffffe4b0);
    local_1318 = (FabArray<amrex::EBCellFlagFab> *)(local_13a0 + 0x48);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
               (MFIter *)in_stack_ffffffffffffe4b0);
    local_13a0._64_8_ = local_13a0;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
               (MFIter *)in_stack_ffffffffffffe4b0);
    local_13a8 = local_13e8;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
               (MFIter *)in_stack_ffffffffffffe4b0);
    local_13f0 = local_1430;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
               (MFIter *)in_stack_ffffffffffffe4b0);
    local_1438 = local_1478;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
               (MFIter *)in_stack_ffffffffffffe4b0);
    local_1480 = local_14c0;
    if (local_11a8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      local_1a9c = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffe4b0,
                 in_stack_ffffffffffffe4a8);
      local_1a9c = EBCellFlagFab::getType(in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    }
    local_14c4 = local_1a9c;
    if (local_1a9c == covered) {
      local_1100 = local_12f0;
      local_368 = local_12f0;
      local_36c = 0;
      local_10f4 = *(int *)&local_12f0->_vptr__Sp_counted_base;
      local_378 = local_12f0;
      local_37c = 1;
      iStack_10f0 = *(int *)((long)&local_12f0->_vptr__Sp_counted_base + 4);
      local_14e0 = local_12f0->_vptr__Sp_counted_base;
      local_388 = local_12f0;
      local_38c = 2;
      local_14d8 = local_12f0->_M_use_count;
      local_10b0 = local_12f0;
      local_3c8 = &local_12f0->_M_weak_count;
      local_3cc = 0;
      local_10a4 = *local_3c8;
      local_3d8 = &local_12f0->_M_weak_count;
      local_3dc = 1;
      iStack_10a0 = *(int *)&local_12f0[1]._vptr__Sp_counted_base;
      local_1500 = *(undefined8 *)local_3c8;
      local_3e8 = &local_12f0->_M_weak_count;
      local_3ec = 2;
      local_14f8 = *(int *)((long)&local_12f0[1]._vptr__Sp_counted_base + 4);
      for (local_1504 = 0; iVar1 = local_14d8, local_14ec = local_1500, local_14e4 = local_14f8,
          local_14d0 = local_14e0, local_14c8 = local_14d8, local_1110 = local_14e0,
          local_1108 = local_14d8, local_10ec = local_14d8, local_10c0 = local_1500,
          local_10b8 = local_14f8, local_109c = local_14f8, local_1504 < local_1200;
          local_1504 = local_1504 + 1) {
        while (local_1508 = iVar1, iVar1 = iStack_10f0, local_1508 <= local_14f8) {
          while (local_150c = iVar1, iVar1 = local_10f4, local_150c <= iStack_10a0) {
            while (local_1510 = iVar1, local_1510 <= local_10a4) {
              local_1088 = (MultiCutFab *)local_13a0._64_8_;
              local_108c = local_1510;
              local_1090 = local_150c;
              local_1094 = local_1508;
              local_1098 = local_1504;
              *(undefined8 *)
               (*(long *)local_13a0._64_8_ +
               ((long)(local_1510 - *(int *)(local_13a0._64_8_ + 0x20)) +
                (long)(local_150c - *(int *)(local_13a0._64_8_ + 0x24)) *
                *(long *)&((BoxArray *)(local_13a0._64_8_ + 8))->m_bat +
                (long)(local_1508 - *(int *)(local_13a0._64_8_ + 0x28)) *
                *(long *)&((Geometry *)(local_13a0._64_8_ + 0x10))->super_CoordSys +
               (long)local_1504 * (long)*(Real *)(local_13a0._64_8_ + 0x18)) * 8) = 0;
              iVar1 = local_1510 + 1;
            }
            iVar1 = local_150c + 1;
          }
          iVar1 = local_1508 + 1;
        }
      }
    }
    else if (local_1a9c == regular) {
      local_1128 = local_12f0;
      local_338 = local_12f0;
      local_33c = 0;
      local_111c = *(int *)&local_12f0->_vptr__Sp_counted_base;
      local_348 = local_12f0;
      local_34c = 1;
      iStack_1118 = *(int *)((long)&local_12f0->_vptr__Sp_counted_base + 4);
      local_1530 = local_12f0->_vptr__Sp_counted_base;
      local_358 = local_12f0;
      local_35c = 2;
      local_1528 = local_12f0->_M_use_count;
      local_10d8 = local_12f0;
      local_398 = &local_12f0->_M_weak_count;
      local_39c = 0;
      local_10cc = *local_398;
      local_3a8 = &local_12f0->_M_weak_count;
      local_3ac = 1;
      iStack_10c8 = *(int *)&local_12f0[1]._vptr__Sp_counted_base;
      local_1550 = *(undefined8 *)local_398;
      local_3b8 = &local_12f0->_M_weak_count;
      local_3bc = 2;
      local_1548 = *(int *)((long)&local_12f0[1]._vptr__Sp_counted_base + 4);
      for (local_1554 = 0; iVar1 = local_1528, local_153c = local_1550, local_1534 = local_1548,
          local_1520 = local_1530, local_1518 = local_1528, local_1138 = local_1530,
          local_1130 = local_1528, local_1114 = local_1528, local_10e8 = local_1550,
          local_10e0 = local_1548, local_10c4 = local_1548, local_1554 < local_1200;
          local_1554 = local_1554 + 1) {
        while (local_1558 = iVar1, iVar1 = iStack_1118, local_1558 <= local_1548) {
          while (local_155c = iVar1, iVar1 = local_111c, local_155c <= iStack_10c8) {
            while (local_1560 = iVar1, local_1560 <= local_10cc) {
              local_1014 = local_1560;
              local_1018 = local_155c;
              local_101c = local_1558;
              local_1020 = local_1554;
              local_1028 = (MultiCutFab *)local_13a0._64_8_;
              local_1030 = local_1318;
              local_1038 = local_13a8;
              local_1040 = local_13f0;
              local_1048 = local_1438;
              local_1050 = local_1480;
              local_1060 = local_1248;
              local_1068 = local_1250;
              local_1058 = &local_1198;
              local_21c = 0;
              local_22c = 0;
              local_1070 = local_1250 * local_1198.arr[0] * local_1198.arr[0];
              local_23c = 1;
              local_24c = 1;
              local_1078 = local_1250 * local_1198.arr[1] * local_1198.arr[1];
              local_25c = 2;
              local_26c = 2;
              local_1080 = local_1250 * local_1198.arr[2] * local_1198.arr[2];
              local_200 = local_13a8;
              local_204 = local_1560;
              local_208 = local_155c;
              local_20c = local_1558;
              local_38 = local_1318;
              local_3c = local_1560;
              local_40 = local_155c;
              local_44 = local_1558;
              local_48 = local_1554;
              local_50 = local_13f0;
              local_54 = local_1560 + 1;
              local_58 = local_155c;
              local_5c = local_1558;
              local_60 = local_1554;
              local_68 = local_1318;
              local_6c = local_1560 + 1;
              local_70 = local_155c;
              local_74 = local_1558;
              local_78 = local_1554;
              local_80 = local_1318;
              local_84 = local_1560;
              local_88 = local_155c;
              local_8c = local_1558;
              local_90 = local_1554;
              local_98 = local_13f0;
              local_9c = local_1560;
              local_a0 = local_155c;
              local_a4 = local_1558;
              local_a8 = local_1554;
              local_b0 = local_1318;
              local_b4 = local_1560;
              local_b8 = local_155c;
              local_bc = local_1558;
              local_c0 = local_1554;
              local_c8 = local_1318;
              local_cc = local_1560 + -1;
              local_d0 = local_155c;
              local_d4 = local_1558;
              local_d8 = local_1554;
              local_e0 = local_1438;
              local_e4 = local_1560;
              local_e8 = local_155c + 1;
              local_ec = local_1558;
              local_f0 = local_1554;
              local_f8 = local_1318;
              local_fc = local_1560;
              local_100 = local_155c + 1;
              local_104 = local_1558;
              local_108 = local_1554;
              local_110 = local_1318;
              local_114 = local_1560;
              local_118 = local_155c;
              local_11c = local_1558;
              local_120 = local_1554;
              local_128 = local_1438;
              local_12c = local_1560;
              local_130 = local_155c;
              local_134 = local_1558;
              local_138 = local_1554;
              local_140 = local_1318;
              local_144 = local_1560;
              local_148 = local_155c;
              local_14c = local_1558;
              local_150 = local_1554;
              local_158 = local_1318;
              local_15c = local_1560;
              local_160 = local_155c + -1;
              local_164 = local_1558;
              local_168 = local_1554;
              local_170 = local_1480;
              local_174 = local_1560;
              local_178 = local_155c;
              local_17c = local_1558 + 1;
              local_180 = local_1554;
              local_188 = local_1318;
              local_18c = local_1560;
              local_190 = local_155c;
              local_194 = local_1558 + 1;
              local_198 = local_1554;
              local_1a0 = local_1318;
              local_1a4 = local_1560;
              local_1a8 = local_155c;
              local_1ac = local_1558;
              local_1b0 = local_1554;
              local_1b8 = local_1480;
              local_1bc = local_1560;
              local_1c0 = local_155c;
              local_1c4 = local_1558;
              local_1c8 = local_1554;
              local_1d0 = local_1318;
              local_1d4 = local_1560;
              local_1d8 = local_155c;
              local_1dc = local_1558;
              local_1e0 = local_1554;
              local_1e8 = local_1318;
              local_1ec = local_1560;
              local_1f0 = local_155c;
              local_1f4 = local_1558 + -1;
              local_1f8 = local_1554;
              local_1000 = (MultiCutFab *)local_13a0._64_8_;
              local_1004 = local_1560;
              local_1008 = local_155c;
              local_100c = local_1558;
              local_1010 = local_1554;
              *(double *)
               (*(long *)local_13a0._64_8_ +
               ((long)(local_1560 - *(int *)(local_13a0._64_8_ + 0x20)) +
                (long)(local_155c - *(int *)(local_13a0._64_8_ + 0x24)) *
                *(long *)&((BoxArray *)(local_13a0._64_8_ + 8))->m_bat +
                (long)(local_1558 - *(int *)(local_13a0._64_8_ + 0x28)) *
                *(long *)&((Geometry *)(local_13a0._64_8_ + 0x10))->super_CoordSys +
               (long)local_1554 * (long)*(Real *)(local_13a0._64_8_ + 0x18)) * 8) =
                   -local_1080 *
                   (*(double *)
                     (*local_1480 +
                     ((long)(local_1560 - (int)local_1480[4]) +
                      (long)(local_155c - *(int *)((long)local_1480 + 0x24)) * local_1480[1] +
                      (long)(local_17c - (int)local_1480[5]) * local_1480[2] +
                     (long)local_1554 * local_1480[3]) * 8) *
                    ((double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                             [(long)(local_1560 -
                                    (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                    m_loshft.vect[0]) +
                              (long)(local_155c -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 4)) *
                              *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                              (long)(local_194 -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 8)) *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 4) +
                              (long)local_1554 *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 0xc)] -
                    (double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                            [(long)(local_1560 -
                                   (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                   m_loshft.vect[0]) +
                             (long)(local_155c -
                                   *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                   m_op.m_bndryReg.m_loshft + 4)) *
                             *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                             (long)(local_1558 -
                                   *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                   m_op.m_bndryReg.m_loshft + 8)) *
                             *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                      4) +
                             (long)local_1554 *
                             *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                      0xc)]) +
                   -(*(double *)
                      (*local_1480 +
                      ((long)(local_1560 - (int)local_1480[4]) +
                       (long)(local_155c - *(int *)((long)local_1480 + 0x24)) * local_1480[1] +
                       (long)(local_1558 - (int)local_1480[5]) * local_1480[2] +
                      (long)local_1554 * local_1480[3]) * 8) *
                    ((double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                             [(long)(local_1560 -
                                    (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                    m_loshft.vect[0]) +
                              (long)(local_155c -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 4)) *
                              *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                              (long)(local_1558 -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 8)) *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 4) +
                              (long)local_1554 *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 0xc)] -
                    (double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                            [(long)(local_1560 -
                                   (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                   m_loshft.vect[0]) +
                             (long)(local_155c -
                                   *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                   m_op.m_bndryReg.m_loshft + 4)) *
                             *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                             (long)(local_1f4 -
                                   *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                   m_op.m_bndryReg.m_loshft + 8)) *
                             *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                      4) +
                             (long)local_1554 *
                             *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                      0xc)]))) +
                   -local_1078 *
                   (*(double *)
                     (*local_1438 +
                     ((long)(local_1560 - (int)local_1438[4]) +
                      (long)(local_e8 - *(int *)((long)local_1438 + 0x24)) * local_1438[1] +
                      (long)(local_1558 - (int)local_1438[5]) * local_1438[2] +
                     (long)local_1554 * local_1438[3]) * 8) *
                    ((double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                             [(long)(local_1560 -
                                    (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                    m_loshft.vect[0]) +
                              (long)(local_100 -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 4)) *
                              *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                              (long)(local_1558 -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 8)) *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 4) +
                              (long)local_1554 *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 0xc)] -
                    (double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                            [(long)(local_1560 -
                                   (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                   m_loshft.vect[0]) +
                             (long)(local_155c -
                                   *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                   m_op.m_bndryReg.m_loshft + 4)) *
                             *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                             (long)(local_1558 -
                                   *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                   m_op.m_bndryReg.m_loshft + 8)) *
                             *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                      4) +
                             (long)local_1554 *
                             *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                      0xc)]) +
                   -(*(double *)
                      (*local_1438 +
                      ((long)(local_1560 - (int)local_1438[4]) +
                       (long)(local_155c - *(int *)((long)local_1438 + 0x24)) * local_1438[1] +
                       (long)(local_1558 - (int)local_1438[5]) * local_1438[2] +
                      (long)local_1554 * local_1438[3]) * 8) *
                    ((double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                             [(long)(local_1560 -
                                    (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                    m_loshft.vect[0]) +
                              (long)(local_155c -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 4)) *
                              *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                              (long)(local_1558 -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 8)) *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 4) +
                              (long)local_1554 *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 0xc)] -
                    (double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                            [(long)(local_1560 -
                                   (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                   m_loshft.vect[0]) +
                             (long)(local_160 -
                                   *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                   m_op.m_bndryReg.m_loshft + 4)) *
                             *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                             (long)(local_1558 -
                                   *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                   m_op.m_bndryReg.m_loshft + 8)) *
                             *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                      4) +
                             (long)local_1554 *
                             *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                      0xc)]))) +
                   local_1248 *
                   *(double *)
                    (*local_13a8 +
                    ((long)(local_1560 - (int)local_13a8[4]) +
                     (long)(local_155c - *(int *)((long)local_13a8 + 0x24)) * local_13a8[1] +
                    (long)(local_1558 - (int)local_13a8[5]) * local_13a8[2]) * 8) *
                   (double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                           [(long)(local_1560 -
                                  (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                  m_loshft.vect[0]) +
                            (long)(local_155c -
                                  *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                  m_op.m_bndryReg.m_loshft + 4)) *
                            *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                            (long)(local_1558 -
                                  *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                  m_op.m_bndryReg.m_loshft + 8)) *
                            *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                     4) +
                            (long)local_1554 *
                            *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op +
                                     0xc)] +
                   -(local_1070 *
                    (*(double *)
                      (*local_13f0 +
                      ((long)(local_54 - (int)local_13f0[4]) +
                       (long)(local_155c - *(int *)((long)local_13f0 + 0x24)) * local_13f0[1] +
                       (long)(local_1558 - (int)local_13f0[5]) * local_13f0[2] +
                      (long)local_1554 * local_13f0[3]) * 8) *
                     ((double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                              [(long)(local_6c -
                                     (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg
                                     .m_loshft.vect[0]) +
                               (long)(local_155c -
                                     *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat
                                                     .m_op.m_bndryReg.m_loshft + 4)) *
                               *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                               (long)(local_1558 -
                                     *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat
                                                     .m_op.m_bndryReg.m_loshft + 8)) *
                               *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                        + 4) +
                               (long)local_1554 *
                               *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                        + 0xc)] -
                     (double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                             [(long)(local_1560 -
                                    (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                    m_loshft.vect[0]) +
                              (long)(local_155c -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 4)) *
                              *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                              (long)(local_1558 -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 8)) *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 4) +
                              (long)local_1554 *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 0xc)]) +
                    -(*(double *)
                       (*local_13f0 +
                       ((long)(local_1560 - (int)local_13f0[4]) +
                        (long)(local_155c - *(int *)((long)local_13f0 + 0x24)) * local_13f0[1] +
                        (long)(local_1558 - (int)local_13f0[5]) * local_13f0[2] +
                       (long)local_1554 * local_13f0[3]) * 8) *
                     ((double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                              [(long)(local_1560 -
                                     (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg
                                     .m_loshft.vect[0]) +
                               (long)(local_155c -
                                     *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat
                                                     .m_op.m_bndryReg.m_loshft + 4)) *
                               *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                               (long)(local_1558 -
                                     *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat
                                                     .m_op.m_bndryReg.m_loshft + 8)) *
                               *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                        + 4) +
                               (long)local_1554 *
                               *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                        + 0xc)] -
                     (double)(local_1318->super_FabArrayBase)._vptr_FabArrayBase
                             [(long)(local_cc -
                                    (local_1318->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                    m_loshft.vect[0]) +
                              (long)(local_155c -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 4)) *
                              *(long *)&(local_1318->super_FabArrayBase).boxarray.m_bat +
                              (long)(local_1558 -
                                    *(int *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.
                                                    m_op.m_bndryReg.m_loshft + 8)) *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 4) +
                              (long)local_1554 *
                              *(long *)((long)&(local_1318->super_FabArrayBase).boxarray.m_bat.m_op
                                       + 0xc)]))));
              local_268 = local_1058;
              local_258 = local_1058;
              local_248 = local_1058;
              local_238 = local_1058;
              local_228 = local_1058;
              local_218 = local_1058;
              iVar1 = local_1560 + 1;
            }
            iVar1 = local_155c + 1;
          }
          iVar1 = local_1558 + 1;
        }
      }
    }
    else {
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffe4b8,
                 (MFIter *)in_stack_ffffffffffffe4b0);
      local_1568 = local_15a8;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (in_stack_ffffffffffffe4b8,(MFIter *)in_stack_ffffffffffffe4b0);
      local_15b0 = local_15f0;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
                 (MFIter *)in_stack_ffffffffffffe4b0);
      local_15f8 = local_1638;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe4b0,
                 (size_type)in_stack_ffffffffffffe4a8);
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_1640 = local_1680;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe4b0,
                 (size_type)in_stack_ffffffffffffe4a8);
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_1688 = local_16c8;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe4b0,
                 (size_type)in_stack_ffffffffffffe4a8);
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_16d0 = local_1710;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe4b0,
                 (size_type)in_stack_ffffffffffffe4a8);
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_1718 = local_1758;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe4b0,
                 (size_type)in_stack_ffffffffffffe4a8);
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_1760 = local_17a0;
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe4b0,
                 (size_type)in_stack_ffffffffffffe4a8);
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_17a8 = local_17e8;
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_17f0 = local_1830;
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_1838 = local_1878;
      MultiCutFab::const_array(in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8);
      local_1880 = local_18c0;
      if ((local_11f9 & 1) == 0) {
        memcpy(local_1908,&local_1240,0x3c);
      }
      else {
        Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                      *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
        Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x15084eb);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
                   (MFIter *)in_stack_ffffffffffffe4b0);
      }
      local_18c8 = local_1908;
      if (((local_11f9 & 1) == 0) || ((local_11fa & 1) == 0)) {
        memcpy(local_1950,&local_1240,0x3c);
      }
      else {
        Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      *)in_stack_ffffffffffffe4b0,(size_type)in_stack_ffffffffffffe4a8);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1508567);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4b8,
                   (MFIter *)in_stack_ffffffffffffe4b0);
      }
      local_1910 = local_1950;
      local_1951 = (int)in_RDI[0x65] == 1;
      local_1952 = *(int *)((long)in_RDI + 0x32c) == 3;
      local_1a9d = (bool)local_1952 && local_1148 == 0;
      local_1953 = local_1a9d;
      if ((bool)local_1952 && local_1148 == 0) {
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe4b0);
        local_1960 = local_1988;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe4b0);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe4b0);
        while (bVar2 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_19a0,&local_19b8), bVar2) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_19d4,&local_19a0);
          local_9d8 = &local_19d4;
          local_9e0 = (MultiCutFab *)local_13a0._64_8_;
          local_9e8 = local_1318;
          local_9f0 = local_13a8;
          local_9f8 = local_13f0;
          local_a00 = local_1438;
          local_a08 = local_1480;
          local_a10 = local_15b0;
          local_a18 = local_15f8;
          local_a20 = local_1640;
          local_a28 = local_1688;
          local_a30 = local_16d0;
          local_a38 = local_1718;
          local_a40 = local_1760;
          local_a48 = local_17a8;
          local_a50 = local_1880;
          local_a58 = local_17f0;
          local_a60 = local_1838;
          local_a68 = local_18c8;
          local_a70 = local_1910;
          local_a78 = &local_125c;
          local_a80 = &local_1264;
          local_a88 = &local_126c;
          local_a90 = &local_1260;
          local_a98 = &local_1268;
          local_aa0 = &local_1270;
          local_aa8 = &local_1271;
          local_ab0 = &local_1272;
          local_ab8 = &local_1273;
          local_ab9 = local_11f9 & 1;
          local_aba = local_11fa & 1;
          local_ac8 = &local_1198;
          local_ad0 = local_1248;
          local_ad8 = local_1250;
          local_adc = local_1200;
          local_27c = 0;
          local_28c = 0;
          local_ae8 = local_1250 * local_1198.arr[0] * local_1198.arr[0];
          local_29c = 1;
          local_2ac = 1;
          local_af0 = local_1250 * local_1198.arr[1] * local_1198.arr[1];
          local_2bc = 2;
          local_2cc = 2;
          local_af8 = local_1250 * local_1198.arr[2] * local_1198.arr[2];
          in_stack_ffffffffffffe510 = (MultiCutFab *)local_13a0._64_8_;
          local_2c8 = local_ac8;
          local_2b8 = local_ac8;
          local_2a8 = local_ac8;
          local_298 = local_ac8;
          local_288 = local_ac8;
          local_278 = local_ac8;
          memcpy(local_ff8,local_15b0,0x3c);
          memcpy(auStack_fb8,local_9e0,0x3c);
          local_f78 = local_ad0;
          memcpy(auStack_f70,local_9f0,0x3c);
          memcpy(auStack_f30,local_9e8,0x3c);
          local_ef0 = local_ae8;
          memcpy(auStack_ee8,local_9f8,0x3c);
          local_ea8 = local_af0;
          memcpy(auStack_ea0,local_a00,0x3c);
          local_e60 = local_af8;
          memcpy(auStack_e58,local_a08,0x3c);
          memcpy(auStack_e18,local_a18,0x3c);
          memcpy(auStack_dd8,local_a20,0x3c);
          memcpy(auStack_d98,local_a28,0x3c);
          memcpy(auStack_d58,local_a30,0x3c);
          local_d18 = *local_a78;
          local_d14 = *local_a90;
          local_d10 = *local_a80;
          local_d0c = *local_a98;
          local_d08 = *local_a88;
          local_d04 = *local_aa0;
          memcpy(auStack_d00,local_a38,0x3c);
          memcpy(auStack_cc0,local_a70,0x3c);
          memcpy(auStack_c80,local_a50,0x3c);
          memcpy(auStack_c40,local_a60,0x3c);
          local_c00 = local_ab9 & 1;
          local_bff = local_aba & 1;
          local_bfe = *local_aa8 & 1;
          local_bfd = *local_ab0 & 1;
          local_bfc = *local_ab8 & 1;
          memcpy(auStack_bf8,local_a40,0x3c);
          memcpy(auStack_bb8,local_a48,0x3c);
          memcpy(auStack_b78,local_a58,0x3c);
          memcpy(auStack_b38,local_a68,0x3c);
          Loop<amrex::mlebabeclap_adotx_centroid(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,bool_const&,bool_const&,bool_const&,bool,bool,amrex::GpuArray<double,3u>const&,double,double,int)::_lambda(int,int,int,int)_1_>
                    ((Box *)CONCAT44(in_stack_ffffffffffffe50c,in_stack_ffffffffffffe508),
                     (int)((ulong)in_stack_ffffffffffffe500 >> 0x20),
                     (anon_class_1280_34_0a4fdabd *)
                     CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8));
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_19a0);
        }
      }
      else {
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe4b0);
        local_19e0 = local_1a08;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe4b0);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffe4b0);
        while (bVar2 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_1a20,(iterator *)&stack0xffffffffffffe5c8), bVar2) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_1a54,&local_1a20);
          in_stack_ffffffffffffe500 = &local_1a54;
          local_400 = (MultiCutFab *)local_13a0._64_8_;
          local_408 = local_1318;
          local_410 = local_13a8;
          local_418 = local_13f0;
          local_420 = local_1438;
          local_428 = local_1480;
          local_430 = local_1568;
          local_438 = local_15b0;
          local_440 = local_15f8;
          local_448 = local_1640;
          local_450 = local_1688;
          local_458 = local_16d0;
          local_460 = local_1718;
          local_468 = local_1760;
          local_470 = local_17a8;
          local_478 = local_17f0;
          local_480 = local_1838;
          local_488 = local_18c8;
          local_489 = local_11f9 & 1;
          local_498 = local_1910;
          local_499 = local_11fa & 1;
          local_4a8 = &local_1198;
          local_4b0 = local_1248;
          local_4b8 = local_1250;
          local_4bc = local_1200;
          local_4bd = local_1951 & 1;
          local_4be = local_1952 & 1;
          local_2dc = 0;
          local_2ec = 0;
          local_4c8 = local_1250 * local_1198.arr[0] * local_1198.arr[0];
          local_2fc = 1;
          local_30c = 1;
          local_4d0 = local_1250 * local_1198.arr[1] * local_1198.arr[1];
          local_31c = 2;
          local_32c = 2;
          local_4d8 = local_1250 * local_1198.arr[2] * local_1198.arr[2];
          local_4d9 = (local_4bd ^ 0xff) & 1;
          local_4da = (local_4be ^ 0xff) & 1;
          in_stack_ffffffffffffe4b0 = (MultiCutFab *)local_13a0._64_8_;
          in_stack_ffffffffffffe4b8 = local_1318;
          in_stack_ffffffffffffe4ff = local_1952;
          in_stack_ffffffffffffe50c = local_1200;
          local_3f8 = in_stack_ffffffffffffe500;
          local_328 = local_4a8;
          local_318 = local_4a8;
          local_308 = local_4a8;
          local_2f8 = local_4a8;
          local_2e8 = local_4a8;
          local_2d8 = local_4a8;
          memcpy(local_9d0,local_15b0,0x3c);
          memcpy(auStack_990,local_400,0x3c);
          local_950 = local_4b0;
          memcpy(auStack_948,local_410,0x3c);
          memcpy(auStack_908,local_408,0x3c);
          local_8c8 = local_4c8;
          memcpy(auStack_8c0,local_418,0x3c);
          local_880 = local_4d0;
          memcpy(auStack_878,local_420,0x3c);
          local_838 = local_4d8;
          memcpy(auStack_830,local_428,0x3c);
          memcpy(auStack_7f0,local_440,0x3c);
          memcpy(auStack_7b0,local_448,0x3c);
          memcpy(auStack_770,local_450,0x3c);
          memcpy(auStack_730,local_458,0x3c);
          memcpy(auStack_6f0,local_460,0x3c);
          memcpy(auStack_6b0,local_430,0x3c);
          local_670 = local_4d9 & 1;
          local_66f = local_4da & 1;
          local_66e = local_4bd & 1;
          memcpy(auStack_668,local_468,0x3c);
          memcpy(auStack_628,local_470,0x3c);
          local_5e8 = local_489 & 1;
          local_5e7 = local_499 & 1;
          memcpy(auStack_5e0,local_498,0x3c);
          memcpy(auStack_5a0,local_480,0x3c);
          memcpy(auStack_560,local_478,0x3c);
          memcpy(auStack_520,local_488,0x3c);
          Loop<amrex::mlebabeclap_adotx(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,bool,amrex::Array4<double_const>const&,bool,amrex::GpuArray<double,3u>const&,double,double,int,bool,bool)::_lambda(int,int,int,int)_1_>
                    ((Box *)CONCAT44(in_stack_ffffffffffffe50c,in_stack_ffffffffffffe508),
                     (int)((ulong)in_stack_ffffffffffffe500 >> 0x20),
                     (anon_class_1264_28_cfe7304b *)
                     CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8));
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1a20);
        }
      }
    }
    MFIter::operator++(&local_12e8);
  }
  MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe4b0);
  return;
}

Assistant:

void
MLEBABecLap::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLEBABecLap::Fapply()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;
    const auto         ccent = (factory) ? &(factory->getCentroid()) : nullptr;

    const bool is_eb_dirichlet =  isEBDirichlet();
    const bool is_eb_inhomog = m_is_eb_inhomog;

    const int ncomp = getNComp();

    Array4<Real const> foo;

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const Box& domain_box = m_geom[amrlev][mglev].Domain();

    AMREX_D_TERM(
        const int domlo_x = domain_box.smallEnd(0);
        const int domhi_x = domain_box.bigEnd(0);,
        const int domlo_y = domain_box.smallEnd(1);
        const int domhi_y = domain_box.bigEnd(1);,
        const int domlo_z = domain_box.smallEnd(2);
        const int domhi_z = domain_box.bigEnd(2););

    AMREX_D_TERM(
        const bool extdir_x = !(m_geom[amrlev][mglev].isPeriodic(0));,
        const bool extdir_y = !(m_geom[amrlev][mglev].isPeriodic(1));,
        const bool extdir_z = !(m_geom[amrlev][mglev].isPeriodic(2)););

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(out, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real const> const& xfab = in.const_array(mfi);
        Array4<Real> const& yfab = out.array(mfi);
        Array4<Real const> const& afab = acoef.const_array(mfi);
        AMREX_D_TERM(Array4<Real const> const& bxfab = bxcoef.const_array(mfi);,
                     Array4<Real const> const& byfab = bycoef.const_array(mfi);,
                     Array4<Real const> const& bzfab = bzcoef.const_array(mfi););

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        if (fabtyp == FabType::covered) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
            {
                yfab(i,j,k,n) = 0.0;
            });
        } else if (fabtyp == FabType::regular) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
            {
                mlabeclap_adotx(i,j,k,n, yfab, xfab, afab,
                                AMREX_D_DECL(bxfab,byfab,bzfab),
                                dxinvarr, ascalar, bscalar);
            });
        } else {
            Array4<int const> const& ccmfab = ccmask.const_array(mfi);
            Array4<EBCellFlag const> const& flagfab = flags->const_array(mfi);
            Array4<Real const> const& vfracfab = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                         Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                         Array4<Real const> const& apzfab = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcxfab = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcyfab = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fczfab = fcent[2]->const_array(mfi););
            Array4<Real const> const& bafab = barea->const_array(mfi);
            Array4<Real const> const& bcfab = bcent->const_array(mfi);
            Array4<Real const> const& ccfab = ccent->const_array(mfi);
            Array4<Real const> const& bebfab = (is_eb_dirichlet)
                ? m_eb_b_coeffs[amrlev][mglev]->const_array(mfi) : foo;
            Array4<Real const> const& phiebfab = (is_eb_dirichlet && is_eb_inhomog)
                ? m_eb_phi[amrlev]->const_array(mfi) : foo;

            bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);
            bool  phi_on_centroid = (m_phi_loc  == Location::CellCentroid);

            bool treat_phi_as_on_centroid = ( phi_on_centroid && (mglev == 0) );

            if (treat_phi_as_on_centroid) {
#ifdef AMREX_USE_HIP
                // This causes an abort in HIP 4.5 but works in earlier versions
                // A follow-up release should fix this.
                // Error message:
                //   lld: error: ran out of registers during register allocation
                amrex::Abort("MLEBABecLap::Fapply: phi on centroid not supported for HIP");
                amrex::ignore_unused(AMREX_D_DECL(domlo_x, domlo_y, domlo_z),
                                     AMREX_D_DECL(domhi_x, domhi_y, domhi_z),
                                     AMREX_D_DECL(extdir_x, extdir_y, extdir_z));
                amrex::ignore_unused(ccfab);
#else
               AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
               {
                   mlebabeclap_adotx_centroid(tbx, yfab, xfab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                     flagfab, vfracfab,
                                     AMREX_D_DECL(apxfab,apyfab,apzfab),
                                     AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                     ccfab, bafab, bcfab, bebfab, phiebfab,
                                     AMREX_D_DECL(domlo_x, domlo_y, domlo_z),
                                     AMREX_D_DECL(domhi_x, domhi_y, domhi_z),
                                     AMREX_D_DECL(extdir_x, extdir_y, extdir_z),
                                     is_eb_dirichlet, is_eb_inhomog, dxinvarr,
                                     ascalar, bscalar, ncomp);
               });
#endif
            } else {
               AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
               {
                   mlebabeclap_adotx(tbx, yfab, xfab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                     ccmfab, flagfab, vfracfab,
                                     AMREX_D_DECL(apxfab,apyfab,apzfab),
                                     AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                     bafab, bcfab, bebfab,
                                     is_eb_dirichlet,
                                     phiebfab,
                                     is_eb_inhomog, dxinvarr,
                                     ascalar, bscalar, ncomp, beta_on_centroid, phi_on_centroid);
               });
            }
        }
    }
}